

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::end_value_with_numeric_check
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  int iVar5;
  char cVar6;
  size_type sVar7;
  int64_t val;
  string buffer;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  size_type local_48;
  size_type local_40;
  pointer local_38;
  
  pcVar2 = (this->buffer_)._M_dataplus._M_p;
  sVar3 = (this->buffer_)._M_string_length;
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  local_48 = sVar3 - 5;
  sVar7 = 0;
  iVar5 = 0;
  while (sVar3 != sVar7) {
    cVar6 = (char)&local_68;
    switch(iVar5) {
    case 0:
      bVar4 = pcVar2[sVar7];
      if (bVar4 < 0x4e) {
        switch(bVar4) {
        case 0x2d:
          std::__cxx11::string::push_back(cVar6);
          iVar5 = 4;
          break;
        default:
          goto switchD_002e6434_caseD_2e;
        case 0x30:
          goto switchD_002e6434_caseD_30;
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          goto switchD_002e6434_caseD_31;
        case 0x46:
switchD_002e6434_caseD_46:
          if (((local_48 != sVar7) || ((byte)(pcVar2[sVar7 + 1] | 0x20U) != 0x61)) ||
             (((byte)(pcVar2[sVar7 + 2] | 0x20U) != 0x6c ||
              ((byte)(pcVar2[sVar7 + 3] | 0x20U) != 0x73)))) goto switchD_002e6434_caseD_2e;
          iVar5 = 3;
          bVar4 = pcVar2[sVar7 + 4] | 0x20;
LAB_002e667d:
          if (bVar4 != 0x65) goto switchD_002e6434_caseD_2e;
        }
      }
      else {
        if (bVar4 < 0x66) {
          if (bVar4 != 0x4e) {
            if (bVar4 == 0x54) {
LAB_002e65ea:
              if (((sVar3 - 4 == sVar7) && ((byte)(pcVar2[sVar7 + 1] | 0x20U) == 0x72)) &&
                 ((byte)(pcVar2[sVar7 + 2] | 0x20U) == 0x75)) {
                bVar4 = pcVar2[sVar7 + 3];
                iVar5 = 2;
                if (bVar4 == 0x55) break;
                goto LAB_002e667d;
              }
            }
            goto switchD_002e6434_caseD_2e;
          }
        }
        else {
          if (bVar4 == 0x66) goto switchD_002e6434_caseD_46;
          if (bVar4 == 0x74) goto LAB_002e65ea;
          if (bVar4 != 0x6e) goto switchD_002e6434_caseD_2e;
        }
        if (((sVar3 - 4 != sVar7) || ((byte)(pcVar2[sVar7 + 1] | 0x20U) != 0x75)) ||
           (((byte)(pcVar2[sVar7 + 2] | 0x20U) != 0x6c ||
            (iVar5 = 1, (byte)(pcVar2[sVar7 + 3] | 0x20U) != 0x6c))))
        goto switchD_002e6434_caseD_2e;
      }
      break;
    case 4:
      if ((byte)pcVar2[sVar7] - 0x31 < 9) goto switchD_002e6434_caseD_31;
      if (pcVar2[sVar7] != 0x30) goto switchD_002e6434_caseD_2e;
switchD_002e6434_caseD_30:
      iVar5 = 5;
      std::__cxx11::string::push_back(cVar6);
      break;
    case 5:
      cVar1 = pcVar2[sVar7];
      if (cVar1 == '.') {
LAB_002e65bd:
        iVar5 = 7;
        std::__cxx11::string::push_back(cVar6);
      }
      else {
        if ((cVar1 != 'E') && (cVar1 != 'e')) goto switchD_002e6434_caseD_2e;
LAB_002e651b:
        iVar5 = 9;
        std::__cxx11::string::push_back(cVar6);
      }
      break;
    case 6:
      bVar4 = pcVar2[sVar7];
      if (9 < bVar4 - 0x30) {
        if ((bVar4 == 0x65) || (bVar4 == 0x45)) goto LAB_002e651b;
        if (bVar4 == 0x2e) goto LAB_002e65bd;
        goto switchD_002e6434_caseD_2e;
      }
switchD_002e6434_caseD_31:
      iVar5 = 6;
      std::__cxx11::string::push_back(cVar6);
      break;
    case 7:
      if ((byte)(pcVar2[sVar7] - 0x30U) < 10) goto LAB_002e6560;
      goto switchD_002e6434_caseD_2e;
    case 8:
      bVar4 = pcVar2[sVar7];
      if (9 < bVar4 - 0x30) {
        if ((bVar4 == 0x45) || (bVar4 == 0x65)) goto LAB_002e651b;
        goto switchD_002e6434_caseD_2e;
      }
LAB_002e6560:
      iVar5 = 8;
      std::__cxx11::string::push_back(cVar6);
      break;
    case 9:
      bVar4 = pcVar2[sVar7];
      if (bVar4 - 0x30 < 10) goto LAB_002e64ec;
      iVar5 = 9;
      if (bVar4 != 0x2b) {
        if (bVar4 == 0x2d) goto LAB_002e651b;
        goto switchD_002e6434_caseD_2e;
      }
      break;
    case 10:
      if (9 < (byte)(pcVar2[sVar7] - 0x30U)) goto switchD_002e6434_caseD_2e;
LAB_002e64ec:
      iVar5 = 10;
      std::__cxx11::string::push_back(cVar6);
    }
    sVar7 = sVar7 + 1;
    if (iVar5 == 0xb) goto switchD_002e6434_caseD_2e;
  }
  if (iVar5 - 1U < 10) {
    (*(code *)(&DAT_00825254 + *(int *)(&DAT_00825254 + (ulong)(iVar5 - 1U) * 4)))();
    return;
  }
switchD_002e6434_caseD_2e:
  local_38 = (this->buffer_)._M_dataplus._M_p;
  local_40 = (this->buffer_)._M_string_length;
  (*visitor->_vptr_basic_json_visitor[0xc])(visitor,&local_40,0,this,ec);
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

void end_value_with_numeric_check(basic_json_visitor<CharT>& visitor, 
        std::error_code& ec)
    {
        numeric_check_state state = numeric_check_state::initial;
        bool is_negative = false;
        //int precision = 0;
        //uint8_t decimal_places = 0;

        auto last = buffer_.end();

        std::string buffer;
        for (auto p = buffer_.begin(); state != numeric_check_state::not_a_number && p != last; ++p)
        {
            switch (state)
            {
                case numeric_check_state::initial:
                {
                    switch (*p)
                    {
                    case 'n':case 'N':
                        if ((last-p) == 4 && (p[1] == 'u' || p[1] == 'U') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 'l' || p[3] == 'L'))
                        {
                            state = numeric_check_state::null;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 't':case 'T':
                        if ((last-p) == 4 && (p[1] == 'r' || p[1] == 'R') && (p[2] == 'u' || p[2] == 'U') && (p[3] == 'e' || p[3] == 'U'))
                        {
                            state = numeric_check_state::boolean_true;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 'f':case 'F':
                        if ((last-p) == 5 && (p[1] == 'a' || p[1] == 'A') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 's' || p[3] == 'S') && (p[4] == 'e' || p[4] == 'E'))
                        {
                            state = numeric_check_state::boolean_false;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case '-':
                        is_negative = true;
                        buffer.push_back(*p);
                        state = numeric_check_state::minus;
                        break;
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::zero:
                {
                    switch (*p)
                    {
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::integer:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        break;
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::minus:
                {
                    switch (*p)
                    {
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction1:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        state = numeric_check_state::fraction;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp1:
                {
                    switch (*p)
                    {
                    case '-':
                        buffer.push_back(*p);
                        break;
                    case '+':
                        break;
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        state = numeric_check_state::exp;
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                default:
                    break;
            }
        }

        switch (state)
        {
            case numeric_check_state::null:
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_true:
                visitor.bool_value(true, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_false:
                visitor.bool_value(false, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::zero:
            case numeric_check_state::integer:
            {
                if (is_negative)
                {
                    int64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.int64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else // Must be overflow
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                }
                else
                {
                    uint64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.uint64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else if (result.ec == jsoncons::detail::to_integer_errc::overflow)
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else
                    {
                        ec = result.ec;
                        more_ = false;
                        return;
                    }
                }
                break;
            }
            case numeric_check_state::fraction:
            case numeric_check_state::exp:
            {
                if (lossless_number_)
                {
                    visitor.string_value(buffer_,semantic_tag::bigdec, *this, ec);
                    more_ = !cursor_mode_;
                }
                else
                {
                    double d = to_double_(buffer.c_str(), buffer.length());
                    visitor.double_value(d, semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                }
                break;
            }
            default:
            {
                visitor.string_value(buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
        }
    }